

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O3

void alist_clone(t_alist *x,t_alist *y,int onset,int count)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  t_listelem *ptVar4;
  long lVar5;
  ulong uVar6;
  
  y->l_pd = alist_class;
  y->l_n = count;
  y->l_npointer = 0;
  ptVar4 = (t_listelem *)getbytes((long)count * 0x28);
  y->l_vec = ptVar4;
  if (ptVar4 != (t_listelem *)0x0) {
    if (0 < count) {
      uVar6 = (ulong)(uint)count;
      lVar5 = 0x10;
      do {
        puVar1 = (undefined8 *)((long)x->l_vec + lVar5 + -0x10 + (long)onset * 0x28);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)y->l_vec + lVar5 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        ptVar4 = y->l_vec;
        if (*(int *)((long)ptVar4 + lVar5 + -0x10) == 3) {
          gpointer_copy(*(t_gpointer **)((long)ptVar4 + lVar5 + -8),
                        (t_gpointer *)((long)&(ptVar4->l_a).a_type + lVar5));
          *(long *)((long)y->l_vec + lVar5 + -8) = (long)&(y->l_vec->l_a).a_type + lVar5;
          y->l_npointer = y->l_npointer + 1;
        }
        lVar5 = lVar5 + 0x28;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    return;
  }
  y->l_n = 0;
  pd_error((void *)0x0,"list_alloc: out of memory");
  return;
}

Assistant:

static void alist_clone(t_alist *x, t_alist *y, int onset, int count)
{
    int i;
    y->l_pd = alist_class;
    y->l_n = count;
    y->l_npointer = 0;
    if (!(y->l_vec = (t_listelem *)getbytes(y->l_n * sizeof(*y->l_vec))))
    {
        y->l_n = 0;
        pd_error(0, "list_alloc: out of memory");
    }
    else for (i = 0; i < count; i++)
    {
        y->l_vec[i].l_a = x->l_vec[onset + i].l_a;
        if (y->l_vec[i].l_a.a_type == A_POINTER)
        {
            gpointer_copy(y->l_vec[i].l_a.a_w.w_gpointer, &y->l_vec[i].l_p);
            y->l_vec[i].l_a.a_w.w_gpointer = &y->l_vec[i].l_p;
            y->l_npointer++;
        }
    }
}